

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O3

Vec_Int_t *
Acb_NtkCollectWindow(Acb_Ntk_t *p,int Pivot,Vec_Int_t *vTfi,Vec_Int_t *vTfo,Vec_Int_t *vRoots)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p_00;
  int *piVar4;
  long lVar5;
  byte bVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar4 = (int *)malloc(400);
  p_00->pArray = piVar4;
  if ((long)vTfi->nSize < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
  }
  if (vTfi->pArray[(long)vTfi->nSize + -1] != Pivot) {
    __assert_fail("Vec_IntEntryLast(vTfi) == Pivot",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbMfs.c"
                  ,0x2ef,
                  "Vec_Int_t *Acb_NtkCollectWindow(Acb_Ntk_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  if ((p->vObjTrav).nSize < 1) {
    uVar1 = (p->vObjType).nCap;
    if ((p->vObjTrav).nCap < (int)uVar1) {
      piVar4 = (p->vObjTrav).pArray;
      if (piVar4 == (int *)0x0) {
        piVar4 = (int *)malloc((long)(int)uVar1 << 2);
      }
      else {
        piVar4 = (int *)realloc(piVar4,(long)(int)uVar1 << 2);
      }
      (p->vObjTrav).pArray = piVar4;
      if (piVar4 == (int *)0x0) goto LAB_003a247e;
      (p->vObjTrav).nCap = uVar1;
    }
    if (0 < (int)uVar1) {
      memset((p->vObjTrav).pArray,0,(ulong)uVar1 * 4);
    }
    (p->vObjTrav).nSize = uVar1;
    iVar2 = p->nObjTravs + 1;
    iVar3 = vTfi->nSize;
    p->nObjTravs = iVar2;
    if (0 < iVar3) goto LAB_003a213a;
  }
  else {
    iVar2 = p->nObjTravs + 1;
    p->nObjTravs = iVar2;
LAB_003a213a:
    piVar4 = vTfi->pArray;
    lVar7 = 0;
    do {
      iVar3 = piVar4[lVar7];
      if (((long)iVar3 < 0) || ((p->vObjTrav).nSize <= iVar3)) goto LAB_003a2386;
      (p->vObjTrav).pArray[iVar3] = iVar2;
      lVar7 = lVar7 + 1;
    } while (lVar7 < vTfi->nSize);
    if (0 < vTfi->nSize) {
      lVar7 = 0;
      do {
        iVar3 = vTfi->pArray[lVar7];
        lVar5 = (long)iVar3;
        if (lVar5 < 1) {
          __assert_fail("i>0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                        ,0xfe,"int Acb_ObjFanOffset(Acb_Ntk_t *, int)");
        }
        if ((p->vObjFans).nSize <= iVar3) goto LAB_003a2386;
        iVar2 = (p->vObjFans).pArray[lVar5];
        lVar9 = (long)iVar2;
        if ((lVar9 < 0) || ((p->vFanSto).nSize <= iVar2)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        piVar4 = (p->vFanSto).pArray;
        lVar8 = (long)piVar4[lVar9];
        bVar6 = 0;
        if (0 < lVar8) {
          lVar10 = 0;
          do {
            iVar2 = piVar4[lVar9 + lVar10 + 1];
            if (((long)iVar2 < 0) || ((p->vObjTrav).nSize <= iVar2)) goto LAB_003a2386;
            lVar10 = lVar10 + 1;
            if ((p->vObjTrav).pArray[iVar2] != p->nObjTravs) {
              bVar6 = 1;
            }
          } while (lVar8 != lVar10);
        }
        if ((p->vObjType).nSize <= iVar3) goto LAB_003a23a5;
        Vec_IntPush(p_00,(uint)((p->vObjType).pArray[lVar5] == '\x03' | bVar6) + iVar3 * 2);
        lVar7 = lVar7 + 1;
      } while (lVar7 < vTfi->nSize);
    }
  }
  if ((p->vObjTrav).nSize < 1) {
    uVar1 = (p->vObjType).nCap;
    if ((p->vObjTrav).nCap < (int)uVar1) {
      piVar4 = (p->vObjTrav).pArray;
      if (piVar4 == (int *)0x0) {
        piVar4 = (int *)malloc((long)(int)uVar1 << 2);
      }
      else {
        piVar4 = (int *)realloc(piVar4,(long)(int)uVar1 << 2);
      }
      (p->vObjTrav).pArray = piVar4;
      if (piVar4 == (int *)0x0) {
LAB_003a247e:
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (p->vObjTrav).nCap = uVar1;
    }
    if (0 < (int)uVar1) {
      memset((p->vObjTrav).pArray,0,(ulong)uVar1 * 4);
    }
    (p->vObjTrav).nSize = uVar1;
  }
  iVar3 = p->nObjTravs + 1;
  p->nObjTravs = iVar3;
  if (0 < vRoots->nSize) {
    piVar4 = vRoots->pArray;
    lVar7 = 0;
    do {
      iVar2 = piVar4[lVar7];
      if (((long)iVar2 < 0) || ((p->vObjTrav).nSize <= iVar2)) goto LAB_003a2386;
      (p->vObjTrav).pArray[iVar2] = iVar3;
      lVar7 = lVar7 + 1;
    } while (lVar7 < vRoots->nSize);
  }
  if (0 < vTfo->nSize) {
    lVar7 = 0;
    do {
      iVar3 = vTfo->pArray[lVar7];
      lVar5 = (long)iVar3;
      if (lVar5 < 1) {
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                      ,0xee,"Acb_ObjType_t Acb_ObjType(Acb_Ntk_t *, int)");
      }
      if ((p->vObjType).nSize <= iVar3) {
LAB_003a23a5:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      if ((p->vObjType).pArray[lVar5] == '\x04') {
        __assert_fail("!Acb_ObjIsCo(p, iObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbMfs.c"
                      ,0x304,
                      "Vec_Int_t *Acb_NtkCollectWindow(Acb_Ntk_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      if ((p->vObjTrav).nSize <= iVar3) {
LAB_003a2386:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      Vec_IntPush(p_00,(uint)((p->vObjTrav).pArray[lVar5] == p->nObjTravs) + iVar3 * 2);
      lVar7 = lVar7 + 1;
    } while (lVar7 < vTfo->nSize);
  }
  return p_00;
}

Assistant:

Vec_Int_t * Acb_NtkCollectWindow( Acb_Ntk_t * p, int Pivot, Vec_Int_t * vTfi, Vec_Int_t * vTfo, Vec_Int_t * vRoots )
{
    Vec_Int_t * vWin = Vec_IntAlloc( 100 );
    int i, k, iObj, iFanin, * pFanins;
    assert( Vec_IntEntryLast(vTfi) == Pivot );
    // mark nodes
    Acb_NtkIncTravId( p );
    Vec_IntForEachEntry( vTfi, iObj, i )
        Acb_ObjSetTravIdCur(p, iObj);
    // add TFI
    Vec_IntForEachEntry( vTfi, iObj, i )
    {
        int fIsTfiInput = 0;
        Acb_ObjForEachFaninFast( p, iObj, pFanins, iFanin, k )
            if ( !Acb_ObjIsTravIdCur(p, iFanin) ) // fanin is not in TFI
                fIsTfiInput = 1; // mark as leaf
        Vec_IntPush( vWin, Abc_Var2Lit(iObj, Acb_ObjIsCi(p, iObj) || fIsTfiInput) );
    }
    // mark roots
    Acb_NtkIncTravId( p );
    Vec_IntForEachEntry( vRoots, iObj, i )
        Acb_ObjSetTravIdCur(p, iObj);
    // add TFO
    Vec_IntForEachEntry( vTfo, iObj, i )
    {
        assert( !Acb_ObjIsCo(p, iObj) );
        Vec_IntPush( vWin, Abc_Var2Lit(iObj, Acb_ObjIsTravIdCur(p, iObj)) );
    }
    return vWin;
}